

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall CClient::OnDemoPlayerSnapshot(CClient *this,void *pData,int Size)

{
  int iVar1;
  CHolder *pCVar2;
  
  iVar1 = (this->m_DemoPlayer).m_Info.m_PreviousTick;
  (this->super_IClient).m_CurGameTick = (this->m_DemoPlayer).m_Info.m_Info.m_CurrentTick;
  (this->super_IClient).m_PrevGameTick = iVar1;
  pCVar2 = this->m_aSnapshots[1];
  this->m_aSnapshots[1] = this->m_aSnapshots[0];
  this->m_aSnapshots[0] = pCVar2;
  mem_copy(pCVar2->m_pSnap,pData,Size);
  mem_copy(this->m_aSnapshots[0]->m_pAltSnap,pData,Size);
  (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[5])();
  return;
}

Assistant:

void CClient::OnDemoPlayerSnapshot(void *pData, int Size)
{
	// update ticks, they could have changed
	const CDemoPlayer::CPlaybackInfo *pInfo = m_DemoPlayer.Info();
	CSnapshotStorage::CHolder *pTemp;
	m_CurGameTick = pInfo->m_Info.m_CurrentTick;
	m_PrevGameTick = pInfo->m_PreviousTick;

	// handle snapshots
	pTemp = m_aSnapshots[SNAP_PREV];
	m_aSnapshots[SNAP_PREV] = m_aSnapshots[SNAP_CURRENT];
	m_aSnapshots[SNAP_CURRENT] = pTemp;

	mem_copy(m_aSnapshots[SNAP_CURRENT]->m_pSnap, pData, Size);
	mem_copy(m_aSnapshots[SNAP_CURRENT]->m_pAltSnap, pData, Size);

	GameClient()->OnNewSnapshot();
}